

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

void Fraig_ManReportChoices(Fraig_Man_t *pMan)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  Fraig_Node_t *pFVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = Fraig_GetMaxLevel(pMan);
  uVar7 = 0;
  Fraig_MappingSetChoiceLevels(pMan,0);
  uVar2 = Fraig_GetMaxLevel(pMan);
  uVar4 = pMan->vNodes->nSize;
  uVar3 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar3 = uVar7;
  }
  uVar4 = 0;
  uVar6 = 0;
  for (; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    pFVar5 = pMan->vNodes->pArray[uVar7];
    if ((pFVar5->pRepr == (Fraig_Node_t *)0x0) && (pFVar5->pNextE != (Fraig_Node_t *)0x0)) {
      for (; pFVar5 != (Fraig_Node_t *)0x0; pFVar5 = pFVar5->pNextE) {
        uVar4 = uVar4 + 1;
      }
      uVar6 = uVar6 + 1;
    }
  }
  printf("Maximum level: Original = %d. Reduced due to choices = %d.\n",(ulong)uVar1,(ulong)uVar2);
  printf("Choice stats:  Choice nodes = %d. Total choices = %d.\n",(ulong)uVar6,(ulong)uVar4);
  return;
}

Assistant:

void Fraig_ManReportChoices( Fraig_Man_t * pMan )
{
    Fraig_Node_t * pNode, * pTemp;
    int nChoiceNodes, nChoices;
    int i, LevelMax1, LevelMax2;

    // report the number of levels
    LevelMax1 = Fraig_GetMaxLevel( pMan );
    Fraig_MappingSetChoiceLevels( pMan, 0 );
    LevelMax2 = Fraig_GetMaxLevel( pMan );

    // report statistics about choices
    nChoiceNodes = nChoices = 0;
    for ( i = 0; i < pMan->vNodes->nSize; i++ )
    {
        pNode = pMan->vNodes->pArray[i];
        if ( pNode->pRepr == NULL && pNode->pNextE != NULL )
        { // this is a choice node = the primary node that has equivalent nodes
            nChoiceNodes++;
            for ( pTemp = pNode; pTemp; pTemp = pTemp->pNextE )
                nChoices++;
        }
    }
    printf( "Maximum level: Original = %d. Reduced due to choices = %d.\n", LevelMax1, LevelMax2 );
    printf( "Choice stats:  Choice nodes = %d. Total choices = %d.\n", nChoiceNodes, nChoices );
}